

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O0

char * nghttp2_strerror(int error_code)

{
  int error_code_local;
  char *local_8;
  
  if (error_code == -0x389) {
    local_8 = "Too many CONTINUATION frames following a HEADER frame";
  }
  else if (error_code == -0x388) {
    local_8 = "Flooding was detected in this HTTP/2 session, and it must be closed";
  }
  else if (error_code == -0x387) {
    local_8 = "Received bad client magic byte string";
  }
  else if (error_code == -0x386) {
    local_8 = "The user callback function failed";
  }
  else if (error_code == -0x385) {
    local_8 = "Out of memory";
  }
  else if (error_code == -0x219) {
    local_8 = "SETTINGS frame contained more than the maximum allowed entries";
  }
  else if (error_code == -0x218) {
    local_8 = 
    "When a local endpoint expects to receive SETTINGS frame, it receives an other type of frame";
  }
  else if (error_code == -0x217) {
    local_8 = "Cancel";
  }
  else if (error_code == -0x216) {
    local_8 = "Internal error";
  }
  else if (error_code == -0x215) {
    local_8 = "Stream was refused";
  }
  else if (error_code == -0x214) {
    local_8 = "Violation in HTTP messaging rule";
  }
  else if (error_code == -0x213) {
    local_8 = "Invalid HTTP header field was received";
  }
  else if (error_code == -0x212) {
    local_8 = "The current session is closing";
  }
  else if (error_code == -0x211) {
    local_8 = "DATA or HEADERS frame has already been submitted for the stream";
  }
  else if (error_code == -0x210) {
    local_8 = "Server push is disabled by peer";
  }
  else if (error_code == -0x20f) {
    local_8 = "Too many inflight SETTINGS";
  }
  else if (error_code == -0x20e) {
    local_8 = "Callback was paused by the application";
  }
  else if (error_code == -0x20d) {
    local_8 = "Insufficient buffer size given to function";
  }
  else if (error_code == -0x20c) {
    local_8 = "Flow control error";
  }
  else if (error_code == -0x20b) {
    local_8 = "Header compression/decompression error";
  }
  else if (error_code == -0x20a) {
    local_8 = "The length of the frame is invalid";
  }
  else if (error_code == -0x209) {
    local_8 = "The user callback function failed due to the temporal error";
  }
  else if (error_code == -0x207) {
    local_8 = "Invalid state";
  }
  else if (error_code == -0x206) {
    local_8 = "Invalid header block";
  }
  else if (error_code == -0x205) {
    local_8 = "GOAWAY has already been sent";
  }
  else if (error_code == -0x204) {
    local_8 = "request HEADERS is not allowed";
  }
  else if (error_code == -0x203) {
    local_8 = "Another DATA frame has already been deferred";
  }
  else if (error_code == -0x202) {
    local_8 = "Invalid stream state";
  }
  else if (error_code == -0x201) {
    local_8 = "Stream ID is invalid";
  }
  else if (error_code == -0x200) {
    local_8 = "The transmission is not allowed for this stream";
  }
  else if (error_code == -0x1ff) {
    local_8 = "Stream is closing";
  }
  else if (error_code == -0x1fe) {
    local_8 = "Stream was already closed or invalid";
  }
  else if (error_code == -0x1fd) {
    local_8 = "No more Stream ID available";
  }
  else if (error_code == -0x1fc) {
    local_8 = "Data transfer deferred";
  }
  else if (error_code == -0x1fb) {
    local_8 = "EOF";
  }
  else if (error_code == -0x1fa) {
    local_8 = "Invalid frame octets";
  }
  else if (error_code == -0x1f9) {
    local_8 = "Protocol error";
  }
  else if (error_code == -0x1f8) {
    local_8 = "Operation would block";
  }
  else if (error_code == -0x1f7) {
    local_8 = "Unsupported SPDY version";
  }
  else if (error_code == -0x1f6) {
    local_8 = "Out of buffer space";
  }
  else if (error_code == -0x1f5) {
    local_8 = "Invalid argument";
  }
  else if (error_code == 0) {
    local_8 = "Success";
  }
  else {
    local_8 = "Unknown error code";
  }
  return local_8;
}

Assistant:

const char *nghttp2_strerror(int error_code) {
  switch (error_code) {
  case 0:
    return "Success";
  case NGHTTP2_ERR_INVALID_ARGUMENT:
    return "Invalid argument";
  case NGHTTP2_ERR_BUFFER_ERROR:
    return "Out of buffer space";
  case NGHTTP2_ERR_UNSUPPORTED_VERSION:
    return "Unsupported SPDY version";
  case NGHTTP2_ERR_WOULDBLOCK:
    return "Operation would block";
  case NGHTTP2_ERR_PROTO:
    return "Protocol error";
  case NGHTTP2_ERR_INVALID_FRAME:
    return "Invalid frame octets";
  case NGHTTP2_ERR_EOF:
    return "EOF";
  case NGHTTP2_ERR_DEFERRED:
    return "Data transfer deferred";
  case NGHTTP2_ERR_STREAM_ID_NOT_AVAILABLE:
    return "No more Stream ID available";
  case NGHTTP2_ERR_STREAM_CLOSED:
    return "Stream was already closed or invalid";
  case NGHTTP2_ERR_STREAM_CLOSING:
    return "Stream is closing";
  case NGHTTP2_ERR_STREAM_SHUT_WR:
    return "The transmission is not allowed for this stream";
  case NGHTTP2_ERR_INVALID_STREAM_ID:
    return "Stream ID is invalid";
  case NGHTTP2_ERR_INVALID_STREAM_STATE:
    return "Invalid stream state";
  case NGHTTP2_ERR_DEFERRED_DATA_EXIST:
    return "Another DATA frame has already been deferred";
  case NGHTTP2_ERR_START_STREAM_NOT_ALLOWED:
    return "request HEADERS is not allowed";
  case NGHTTP2_ERR_GOAWAY_ALREADY_SENT:
    return "GOAWAY has already been sent";
  case NGHTTP2_ERR_INVALID_HEADER_BLOCK:
    return "Invalid header block";
  case NGHTTP2_ERR_INVALID_STATE:
    return "Invalid state";
  case NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE:
    return "The user callback function failed due to the temporal error";
  case NGHTTP2_ERR_FRAME_SIZE_ERROR:
    return "The length of the frame is invalid";
  case NGHTTP2_ERR_HEADER_COMP:
    return "Header compression/decompression error";
  case NGHTTP2_ERR_FLOW_CONTROL:
    return "Flow control error";
  case NGHTTP2_ERR_INSUFF_BUFSIZE:
    return "Insufficient buffer size given to function";
  case NGHTTP2_ERR_PAUSE:
    return "Callback was paused by the application";
  case NGHTTP2_ERR_TOO_MANY_INFLIGHT_SETTINGS:
    return "Too many inflight SETTINGS";
  case NGHTTP2_ERR_PUSH_DISABLED:
    return "Server push is disabled by peer";
  case NGHTTP2_ERR_DATA_EXIST:
    return "DATA or HEADERS frame has already been submitted for the stream";
  case NGHTTP2_ERR_SESSION_CLOSING:
    return "The current session is closing";
  case NGHTTP2_ERR_HTTP_HEADER:
    return "Invalid HTTP header field was received";
  case NGHTTP2_ERR_HTTP_MESSAGING:
    return "Violation in HTTP messaging rule";
  case NGHTTP2_ERR_REFUSED_STREAM:
    return "Stream was refused";
  case NGHTTP2_ERR_INTERNAL:
    return "Internal error";
  case NGHTTP2_ERR_CANCEL:
    return "Cancel";
  case NGHTTP2_ERR_SETTINGS_EXPECTED:
    return "When a local endpoint expects to receive SETTINGS frame, it "
           "receives an other type of frame";
  case NGHTTP2_ERR_NOMEM:
    return "Out of memory";
  case NGHTTP2_ERR_CALLBACK_FAILURE:
    return "The user callback function failed";
  case NGHTTP2_ERR_BAD_CLIENT_MAGIC:
    return "Received bad client magic byte string";
  case NGHTTP2_ERR_FLOODED:
    return "Flooding was detected in this HTTP/2 session, and it must be "
           "closed";
  case NGHTTP2_ERR_TOO_MANY_SETTINGS:
    return "SETTINGS frame contained more than the maximum allowed entries";
  case NGHTTP2_ERR_TOO_MANY_CONTINUATIONS:
    return "Too many CONTINUATION frames following a HEADER frame";
  default:
    return "Unknown error code";
  }
}